

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::nmorer(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint x;
  uint x_00;
  ulong n;
  
  requireDStackDepth(this,1,"N>R");
  this_00 = &this->dStack;
  x = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  n = (ulong)x;
  requireDStackDepth(this,n,"N>R");
  requireRStackAvailable(this,(ulong)(x + 1),">R");
  if (x != 0) {
    do {
      x_00 = ForthStack<unsigned_int>::getTop(this_00);
      ForthStack<unsigned_int>::push(&this->rStack,x_00);
      ForthStack<unsigned_int>::pop(this_00);
      n = n - 1;
    } while (n != 0);
  }
  ForthStack<unsigned_int>::push(&this->rStack,x);
  return;
}

Assistant:

void nmorer() {
			REQUIRE_DSTACK_DEPTH(1, "N>R");
			auto index = dStack.getTop(); pop();
			REQUIRE_DSTACK_DEPTH(index, "N>R");
			REQUIRE_RSTACK_AVAILABLE(index+1, ">R");
			for(size_t i=0;i<index;++i){
			 rpush(dStack.getTop()); pop();
			}
			rpush(index);
		}